

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQInteger __thiscall SQCompiler::Factor(SQCompiler *this)

{
  long lVar1;
  SQFuncState *this_00;
  SQFuncState *this_01;
  SQChar *s;
  SQFuncState *pSVar2;
  bool bVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQInteger arg0;
  SQInteger SVar6;
  SQObject SVar7;
  SQInteger array;
  SQInteger val;
  SQInteger key;
  SQInteger apos;
  undefined1 local_e8 [4];
  SQObjectType ctype;
  SQObjectType local_d8;
  undefined4 uStack_d4;
  SQObjectValue SStack_d0;
  SQObjectType local_c8;
  SQObjectValue local_c0;
  undefined1 auStack_a8 [8];
  SQObject constid;
  undefined1 local_90 [8];
  SQObjectPtr constval;
  SQInteger pos;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined1 local_48 [8];
  SQObject constant;
  SQObject id;
  SQCompiler *this_local;
  
  lVar1 = this->_token;
  if (lVar1 == 0x21) {
    Lex(this);
    UnaryOP(this,_OP_NOT);
  }
  else if (lVar1 == 0x28) {
    Lex(this);
    CommaExpr(this);
    Expect(this,0x29);
  }
  else if (lVar1 == 0x2d) {
    Lex(this);
    if (this->_token == 0x104) {
      EmitLoadConstInt(this,-(this->_lex)._nvalue,-1);
      Lex(this);
    }
    else if (this->_token == 0x105) {
      EmitLoadConstFloat(this,-(this->_lex)._fvalue,-1);
      Lex(this);
    }
    else {
      UnaryOP(this,_OP_NEG);
    }
  }
  else if (lVar1 == 0x40) {
    FunctionExp(this,this->_token,true);
  }
  else if (lVar1 == 0x5b) {
    pSVar2 = this->_fs;
    SVar5 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(pSVar2,_OP_NEWOBJ,SVar5,0,0,1);
    SVar5 = SQFuncState::GetCurrentPos(this->_fs);
    val = 0;
    Lex(this);
    while (this->_token != 0x5d) {
      Expression(this);
      if (this->_token == 0x2c) {
        Lex(this);
      }
      SVar6 = SQFuncState::PopTarget(this->_fs);
      arg0 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddInstruction(this->_fs,_OP_APPENDARRAY,arg0,SVar6,0,0);
      val = val + 1;
    }
    SQFuncState::SetIntructionParam(this->_fs,SVar5,1,val);
    Lex(this);
  }
  else if (lVar1 == 0x7b) {
    pSVar2 = this->_fs;
    SVar5 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(pSVar2,_OP_NEWOBJ,SVar5,0,0,0);
    Lex(this);
    ParseTableOrClass(this,0x2c,0x7d);
  }
  else if (lVar1 == 0x7e) {
    Lex(this);
    if (this->_token == 0x104) {
      EmitLoadConstInt(this,(this->_lex)._nvalue ^ 0xffffffffffffffff,-1);
      Lex(this);
    }
    else {
      UnaryOP(this,_OP_BWNOT);
    }
  }
  else {
    if (lVar1 == 0x102) goto LAB_0012416d;
    if (lVar1 == 0x103) {
      pSVar2 = this->_fs;
      SVar5 = SQFuncState::PushTarget(this->_fs,-1);
      this_00 = this->_fs;
      this_01 = this->_fs;
      s = (this->_lex)._svalue;
      SVar4 = sqvector<char>::size(&(this->_lex)._longstr);
      SVar7 = SQFuncState::CreateString(this_01,s,SVar4 - 1);
      id._unVal.fFloat = (SQFloat)SVar7._type;
      SVar6 = SQFuncState::GetConstant(this_00,(SQObject *)&id._unVal);
      SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar5,SVar6,0,0);
      Lex(this);
    }
    else if (lVar1 == 0x104) {
      EmitLoadConstInt(this,(this->_lex)._nvalue,-1);
      Lex(this);
    }
    else if (lVar1 == 0x105) {
      EmitLoadConstFloat(this,(this->_lex)._fvalue,-1);
      Lex(this);
    }
    else {
      if (lVar1 == 0x106) {
        Lex(this);
        pSVar2 = this->_fs;
        SVar5 = SQFuncState::PushTarget(this->_fs,-1);
        SQFuncState::AddInstruction(pSVar2,_OP_GETBASE,SVar5,0,0,0);
        (this->_es).etype = 3;
        SVar5 = SQFuncState::TopTarget(this->_fs);
        (this->_es).epos = SVar5;
        return (this->_es).epos;
      }
      if (lVar1 == 0x107) {
        DeleteExpr(this);
      }
      else if (lVar1 == 0x116) {
        pSVar2 = this->_fs;
        SVar5 = SQFuncState::PushTarget(this->_fs,-1);
        SQFuncState::AddInstruction(pSVar2,_OP_LOADNULLS,SVar5,1,0,0);
        Lex(this);
      }
      else if (lVar1 == 0x11c) {
        Lex(this);
        UnaryOP(this,_OP_CLONE);
      }
      else if (lVar1 == 0x11d) {
        FunctionExp(this,this->_token,false);
      }
      else if (lVar1 == 0x11f) {
        Lex(this);
        UnaryOP(this,_OP_TYPEOF);
      }
      else if (lVar1 == 0x12a) {
        Lex(this);
        UnaryOP(this,_OP_RESUME);
      }
      else {
        if (lVar1 == 299) {
          pSVar2 = this->_fs;
          SVar5 = SQFuncState::PushTarget(this->_fs,-1);
          SQFuncState::AddInstruction(pSVar2,_OP_LOADROOT,SVar5,0,0,0);
          (this->_es).etype = 2;
          this->_token = 0x2e;
          (this->_es).epos = -1;
          return (this->_es).epos;
        }
        if (lVar1 == 0x12e) {
LAB_0012416d:
          lVar1 = this->_token;
          if (lVar1 == 0x102) {
            SVar7 = SQFuncState::CreateString(this->_fs,(this->_lex)._svalue,-1);
            id._0_8_ = SVar7._unVal;
            constant._unVal.nInteger._4_4_ = uStack_54;
            constant._unVal.fFloat = (SQFloat)SVar7._type;
          }
          else if (lVar1 == 0x12e) {
            SVar7 = SQFuncState::CreateString(this->_fs,"this",4);
            id._0_8_ = SVar7._unVal;
            constant._unVal.nInteger._4_4_ = uStack_64;
            constant._unVal.fFloat = (SQFloat)SVar7._type;
          }
          else if (lVar1 == 0x136) {
            SVar7 = SQFuncState::CreateString(this->_fs,"constructor",0xb);
            id._0_8_ = SVar7._unVal;
            constant._unVal.nInteger._4_4_ = pos._4_4_;
            constant._unVal.fFloat = (SQFloat)SVar7._type;
          }
          constval.super_SQObject._unVal.nInteger = -1;
          Lex(this);
          constval.super_SQObject._unVal.nInteger =
               SQFuncState::GetLocalVariable(this->_fs,(SQObject *)&constant._unVal);
          if (constval.super_SQObject._unVal.pTable == (SQTable *)0xffffffffffffffff) {
            constval.super_SQObject._unVal.nInteger =
                 SQFuncState::GetOuterVariable(this->_fs,(SQObject *)&constant._unVal);
            if (constval.super_SQObject._unVal.pTable == (SQTable *)0xffffffffffffffff) {
              bVar3 = SQFuncState::IsConstant
                                (this->_fs,(SQObject *)&constant._unVal,(SQObject *)local_48);
              if (bVar3) {
                ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_90);
                if (local_48._0_4_ == OT_TABLE) {
                  SVar7 = Expect(this,0x2e);
                  local_c0 = SVar7._unVal;
                  local_c8 = SVar7._type;
                  SVar7 = Expect(this,0x102);
                  SStack_d0 = SVar7._unVal;
                  local_d8 = SVar7._type;
                  auStack_a8._4_4_ = uStack_d4;
                  auStack_a8._0_4_ = local_d8;
                  constid._0_8_ = SStack_d0.nInteger;
                  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_e8,(SQObject *)auStack_a8);
                  bVar3 = SQTable::Get((SQTable *)constant._0_8_,(SQObjectPtr *)local_e8,
                                       (SQObjectPtr *)local_90);
                  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_e8);
                  if (((bVar3 ^ 0xffU) & 1) != 0) {
                    ::SQObjectPtr::Null((SQObjectPtr *)local_90);
                    Error(this,"invalid constant [%s.%s]",id._0_8_ + 0x38,constid._0_8_ + 0x38);
                  }
                }
                else {
                  ::SQObjectPtr::operator=((SQObjectPtr *)local_90,(SQObject *)local_48);
                }
                SVar5 = SQFuncState::PushTarget(this->_fs,-1);
                (this->_es).epos = SVar5;
                if (local_90._0_4_ == OT_BOOL) {
                  SQFuncState::AddInstruction
                            (this->_fs,_OP_LOADBOOL,(this->_es).epos,
                             CONCAT44(constval.super_SQObject._4_4_,constval.super_SQObject._type),0
                             ,0);
                }
                else if (local_90._0_4_ == OT_INTEGER) {
                  EmitLoadConstInt(this,CONCAT44(constval.super_SQObject._4_4_,
                                                 constval.super_SQObject._type),(this->_es).epos);
                }
                else if (local_90._0_4_ == OT_FLOAT) {
                  EmitLoadConstFloat(this,(SQFloat)constval.super_SQObject._type,(this->_es).epos);
                }
                else {
                  pSVar2 = this->_fs;
                  SVar5 = (this->_es).epos;
                  SVar6 = SQFuncState::GetConstant(pSVar2,(SQObject *)local_90);
                  SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar5,SVar6,0,0);
                }
                (this->_es).etype = 1;
                ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_90);
              }
              else {
                SQFuncState::PushTarget(this->_fs,0);
                pSVar2 = this->_fs;
                SVar5 = SQFuncState::PushTarget(this->_fs,-1);
                SVar6 = SQFuncState::GetConstant(this->_fs,(SQObject *)&constant._unVal);
                SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar5,SVar6,0,0);
                bVar3 = NeedGet(this);
                if (bVar3) {
                  Emit2ArgsOP(this,_OP_GET,0);
                }
                (this->_es).etype = 2;
              }
            }
            else {
              bVar3 = NeedGet(this);
              if (bVar3) {
                SVar5 = SQFuncState::PushTarget(this->_fs,-1);
                (this->_es).epos = SVar5;
                SQFuncState::AddInstruction
                          (this->_fs,_OP_GETOUTER,(this->_es).epos,
                           constval.super_SQObject._unVal.nInteger,0,0);
              }
              else {
                (this->_es).etype = 5;
                (this->_es).epos = (SQInteger)constval.super_SQObject._unVal;
              }
            }
          }
          else {
            SQFuncState::PushTarget(this->_fs,constval.super_SQObject._unVal.nInteger);
            (this->_es).etype = 4;
            (this->_es).epos = (SQInteger)constval.super_SQObject._unVal;
          }
          return (this->_es).epos;
        }
        if (lVar1 - 0x12fU < 2) {
          PrefixIncDec(this,this->_token);
        }
        else if (lVar1 == 0x133) {
          Lex(this);
          ClassExp(this);
        }
        else {
          if (lVar1 == 0x136) goto LAB_0012416d;
          if (lVar1 == 0x139) {
            EmitLoadConstInt(this,(this->_lex)._currentline,-1);
            Lex(this);
          }
          else if (lVar1 == 0x13a) {
            pSVar2 = this->_fs;
            SVar5 = SQFuncState::PushTarget(this->_fs,-1);
            SVar6 = SQFuncState::GetConstant(this->_fs,&(this->_sourcename).super_SQObject);
            SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar5,SVar6,0,0);
            Lex(this);
          }
          else if (lVar1 - 0x13bU < 2) {
            pSVar2 = this->_fs;
            SVar5 = SQFuncState::PushTarget(this->_fs,-1);
            SQFuncState::AddInstruction
                      (pSVar2,_OP_LOADBOOL,SVar5,(long)(int)(uint)(this->_token == 0x13b),0,0);
            Lex(this);
          }
          else if (lVar1 == 0x145) {
            Lex(this);
            Expect(this,0x28);
            FunctionCallArgs(this,true);
          }
          else {
            Error(this,"expression expected");
          }
        }
      }
    }
  }
  (this->_es).etype = 1;
  return -1;
}

Assistant:

SQInteger Factor()
    {
        //_es.etype = EXPR;
        switch(_token)
        {
        case TK_STRING_LITERAL:
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(_lex._svalue,_lex._longstr.size()-1)));
            Lex();
            break;
        case TK_BASE:
            Lex();
            _fs->AddInstruction(_OP_GETBASE, _fs->PushTarget());
            _es.etype  = BASE;
            _es.epos   = _fs->TopTarget();
            return (_es.epos);
            break;
        case TK_IDENTIFIER:
        case TK_CONSTRUCTOR:
        case TK_THIS:{
                SQObject id;
                SQObject constant;

                switch(_token) {
                    case TK_IDENTIFIER:  id = _fs->CreateString(_lex._svalue);       break;
                    case TK_THIS:        id = _fs->CreateString(_SC("this"),4);        break;
                    case TK_CONSTRUCTOR: id = _fs->CreateString(_SC("constructor"),11); break;
                }

                SQInteger pos = -1;
                Lex();
                if((pos = _fs->GetLocalVariable(id)) != -1) {
                    /* Handle a local variable (includes 'this') */
                    _fs->PushTarget(pos);
                    _es.etype  = LOCAL;
                    _es.epos   = pos;
                }

                else if((pos = _fs->GetOuterVariable(id)) != -1) {
                    /* Handle a free var */
                    if(NeedGet()) {
                        _es.epos  = _fs->PushTarget();
                        _fs->AddInstruction(_OP_GETOUTER, _es.epos, pos);
                        /* _es.etype = EXPR; already default value */
                    }
                    else {
                        _es.etype = OUTER;
                        _es.epos  = pos;
                    }
                }

                else if(_fs->IsConstant(id, constant)) {
                    /* Handle named constant */
                    SQObjectPtr constval;
                    SQObject    constid;
                    if(type(constant) == OT_TABLE) {
                        Expect('.');
                        constid = Expect(TK_IDENTIFIER);
                        if(!_table(constant)->Get(constid, constval)) {
                            constval.Null();
                            Error(_SC("invalid constant [%s.%s]"), _stringval(id), _stringval(constid));
                        }
                    }
                    else {
                        constval = constant;
                    }
                    _es.epos = _fs->PushTarget();

                    /* generate direct or literal function depending on size */
                    SQObjectType ctype = type(constval);
                    switch(ctype) {
                        case OT_INTEGER: EmitLoadConstInt(_integer(constval),_es.epos); break;
                        case OT_FLOAT: EmitLoadConstFloat(_float(constval),_es.epos); break;
                        case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _es.epos, _integer(constval)); break;
                        default: _fs->AddInstruction(_OP_LOAD,_es.epos,_fs->GetConstant(constval)); break;
                    }
                    _es.etype = EXPR;
                }
                else {
                    /* Handle a non-local variable, aka a field. Push the 'this' pointer on
                    * the virtual stack (always found in offset 0, so no instruction needs to
                    * be generated), and push the key next. Generate an _OP_LOAD instruction
                    * for the latter. If we are not using the variable as a dref expr, generate
                    * the _OP_GET instruction.
                    */
                    _fs->PushTarget(0);
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                return _es.epos;
            }
            break;
        case TK_DOUBLE_COLON:  // "::"
            _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
            _es.etype = OBJECT;
            _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
            _es.epos = -1;
            return _es.epos;
            break;
        case TK_NULL:
            _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            Lex();
            break;
        case TK_INTEGER: EmitLoadConstInt(_lex._nvalue,-1); Lex();  break;
        case TK_FLOAT: EmitLoadConstFloat(_lex._fvalue,-1); Lex(); break;
        case TK_TRUE: case TK_FALSE:
            _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(),_token == TK_TRUE?1:0);
            Lex();
            break;
        case _SC('['): {
                _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,0,NOT_ARRAY);
                SQInteger apos = _fs->GetCurrentPos(),key = 0;
                Lex();
                while(_token != _SC(']')) {
                    Expression();
                    if(_token == _SC(',')) Lex();
                    SQInteger val = _fs->PopTarget();
                    SQInteger array = _fs->TopTarget();
                    _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
                    key++;
                }
                _fs->SetIntructionParam(apos, 1, key);
                Lex();
            }
            break;
        case _SC('{'):
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            Lex();ParseTableOrClass(_SC(','),_SC('}'));
            break;
        case TK_FUNCTION: FunctionExp(_token);break;
        case _SC('@'): FunctionExp(_token,true);break;
        case TK_CLASS: Lex(); ClassExp();break;
        case _SC('-'):
            Lex();
            switch(_token) {
            case TK_INTEGER: EmitLoadConstInt(-_lex._nvalue,-1); Lex(); break;
            case TK_FLOAT: EmitLoadConstFloat(-_lex._fvalue,-1); Lex(); break;
            default: UnaryOP(_OP_NEG);
            }
            break;
        case _SC('!'): Lex(); UnaryOP(_OP_NOT); break;
        case _SC('~'):
            Lex();
            if(_token == TK_INTEGER)  { EmitLoadConstInt(~_lex._nvalue,-1); Lex(); break; }
            UnaryOP(_OP_BWNOT);
            break;
        case TK_TYPEOF : Lex() ;UnaryOP(_OP_TYPEOF); break;
        case TK_RESUME : Lex(); UnaryOP(_OP_RESUME); break;
        case TK_CLONE : Lex(); UnaryOP(_OP_CLONE); break;
        case TK_RAWCALL: Lex(); Expect('('); FunctionCallArgs(true); break;
        case TK_MINUSMINUS :
        case TK_PLUSPLUS :PrefixIncDec(_token); break;
        case TK_DELETE : DeleteExpr(); break;
        case _SC('('): Lex(); CommaExpr(); Expect(_SC(')'));
            break;
        case TK___LINE__: EmitLoadConstInt(_lex._currentline,-1); Lex(); break;
        case TK___FILE__: _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_sourcename)); Lex(); break;
        default: Error(_SC("expression expected"));
        }
        _es.etype = EXPR;
        return -1;
    }